

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopDescriptor::~LoopDescriptor(LoopDescriptor *this)

{
  LoopDescriptor *this_local;
  
  ClearLoops(this);
  std::
  vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ::~vector(&this->loops_to_add_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  ::~unordered_map(&this->basic_block_to_loop_);
  Loop::~Loop(&this->placeholder_top_loop_);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~vector(&this->loops_)
  ;
  return;
}

Assistant:

LoopDescriptor::~LoopDescriptor() { ClearLoops(); }